

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall
cmListFile::ParseFile
          (cmListFile *this,char *filename,cmMessenger *messenger,cmListFileBacktrace *lfbt)

{
  bool bVar1;
  cmListFileParser parser;
  allocator<char> local_f1;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_f0;
  cmListFileParser local_e0;
  
  bVar1 = cmsys::SystemTools::FileExists(filename);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,filename,&local_f1);
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    if (!bVar1) {
      std::__cxx11::string::assign((char *)&this->Filename);
      std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_f0,
                 (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)lfbt)
      ;
      cmListFileParser::cmListFileParser
                (&local_e0,this,(cmListFileBacktrace *)&local_f0,messenger,filename);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
      bVar1 = cmListFileParser::ParseFile(&local_e0);
      cmListFileParser::~cmListFileParser(&local_e0);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool cmListFile::ParseFile(const char* filename, cmMessenger* messenger,
                           cmListFileBacktrace const& lfbt)
{
  if (!cmSystemTools::FileExists(filename) ||
      cmSystemTools::FileIsDirectory(filename)) {
    return false;
  }

  Filename = filename;

  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger, filename);
    parseError = !parser.ParseFile();
  }

  return !parseError;
}